

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxvolume.cc
# Opt level: O0

void __thiscall ipx::Maxvolume::Slice::Slice(Slice *this,Int m,Int n)

{
  IndexedVector *in_RDI;
  size_t in_stack_ffffffffffffff98;
  Int *__n;
  valarray<double> *in_stack_ffffffffffffffa0;
  valarray<double> *this_00;
  size_type in_stack_ffffffffffffffa8;
  pointer *this_01;
  IndexedVector *this_02;
  
  this_02 = in_RDI;
  std::valarray<double>::valarray(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  std::valarray<double>::valarray(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_01 = &(in_RDI->pattern_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::allocator<bool>::allocator((allocator<bool> *)0x83f1f6);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)this_01,in_stack_ffffffffffffffa8,
             (allocator_type *)in_stack_ffffffffffffffa0);
  std::allocator<bool>::~allocator((allocator<bool> *)0x83f216);
  std::valarray<double>::valarray(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  this_00 = (valarray<double> *)&in_RDI[1].nnz_;
  IndexedVector::IndexedVector(this_02,(Int)((ulong)in_RDI >> 0x20));
  __n = &in_RDI[2].nnz_;
  IndexedVector::IndexedVector(this_02,(Int)((ulong)in_RDI >> 0x20));
  std::valarray<double>::valarray(this_00,(size_t)__n);
  return;
}

Assistant:

Slice(Int m, Int n) :
        colscale(n+m), invscale_basic(m), tblrow_used(m), colweights(n+m),
        lhs(m), row(n+m), work(m) {}